

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManResubPrintLit(Vec_Int_t *vRes,int nVars,int iLit)

{
  int iVar1;
  int fCompl;
  char *pcVar2;
  int iLit_local;
  int nVars_local;
  Vec_Int_t *vRes_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  if (iVar1 < nVars) {
    if (nVars < 0x1a) {
      iVar1 = Abc_LitIsCompl(iLit);
      pcVar2 = "";
      if (iVar1 != 0) {
        pcVar2 = "~";
      }
      iVar1 = Abc_Lit2Var(iLit);
      printf("%s%c",pcVar2,(ulong)(iVar1 + 0x5f));
    }
    else {
      iVar1 = Abc_LitIsCompl(iLit);
      pcVar2 = "";
      if (iVar1 != 0) {
        pcVar2 = "~";
      }
      iVar1 = Abc_Lit2Var(iLit);
      printf("%si%d",pcVar2,(ulong)(iVar1 - 2));
    }
  }
  else {
    iVar1 = Abc_Lit2Var(iLit);
    fCompl = Abc_LitIsCompl(iLit);
    Gia_ManResubPrintNode(vRes,nVars,iVar1 - nVars,fCompl);
  }
  return;
}

Assistant:

void Gia_ManResubPrintLit( Vec_Int_t * vRes, int nVars, int iLit )
{
    if ( Abc_Lit2Var(iLit) < nVars )
    {
        if ( nVars < 26 )
            printf( "%s%c", Abc_LitIsCompl(iLit) ? "~":"", 'a' + Abc_Lit2Var(iLit)-2 );
        else
            printf( "%si%d", Abc_LitIsCompl(iLit) ? "~":"", Abc_Lit2Var(iLit)-2 );
    }
    else
        Gia_ManResubPrintNode( vRes, nVars, Abc_Lit2Var(iLit) - nVars, Abc_LitIsCompl(iLit) );
}